

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshba.cpp
# Opt level: O1

int select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,timeval *__timeout)

{
  char *pcVar1;
  uint uVar2;
  uint __val;
  pointer pHVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  ulong uVar14;
  uint __len;
  string cmd;
  string __str;
  char *local_f0;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while( true ) {
    iVar5 = getKey();
    pHVar3 = hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((iVar5 == 0xd) || (iVar5 == 10)) break;
    iVar6 = -1;
    if ((iVar5 != config.upKey) && (iVar6 = 1, iVar5 != config.downKey)) goto LAB_00104916;
    iVar5 = (int)((ulong)((long)hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3) * -0x3b13b13b;
    currentIndex = ((iVar6 + currentIndex) % iVar5 + iVar5) % iVar5;
    display();
  }
  lVar7 = (long)currentIndex;
  std::operator+(&local_50,"ssh ",
                 &hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7].userName);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar8;
  plVar12 = plVar8 + 2;
  if (local_70 == plVar12) {
    local_60 = *plVar12;
    lStack_58 = plVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar12;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)pHVar3[lVar7].address._M_dataplus._M_p);
  local_90 = (long *)*plVar8;
  plVar12 = plVar8 + 2;
  if (local_90 == plVar12) {
    local_80 = *plVar12;
    lStack_78 = plVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar12;
  }
  local_88 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_b0 = (ulong *)*plVar8;
  puVar13 = (ulong *)(plVar8 + 2);
  if (local_b0 == puVar13) {
    local_a0 = *puVar13;
    lStack_98 = plVar8[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar13;
  }
  local_a8 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar2 = pHVar3[lVar7].port;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar14 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar11 = (uint)uVar14;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_00104775;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_00104775;
      }
      if (uVar11 < 10000) goto LAB_00104775;
      uVar14 = uVar14 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_00104775:
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_d0),__len,__val);
  uVar14 = 0xf;
  if (local_b0 != &local_a0) {
    uVar14 = local_a0;
  }
  if (uVar14 < (ulong)(local_c8 + local_a8)) {
    uVar14 = 0xf;
    if (local_d0 != local_c0) {
      uVar14 = local_c0[0];
    }
    if ((ulong)(local_c8 + local_a8) <= uVar14) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00104810;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
LAB_00104810:
  local_f0 = (char *)*puVar9;
  pcVar1 = (char *)(puVar9 + 2);
  if (local_f0 == pcVar1) {
    local_e0 = *(undefined8 *)pcVar1;
    uStack_d8 = puVar9[3];
    local_f0 = (char *)&local_e0;
  }
  else {
    local_e0 = *(undefined8 *)pcVar1;
  }
  lVar7 = puVar9[1];
  *puVar9 = pcVar1;
  puVar9[1] = 0;
  *pcVar1 = '\0';
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  poVar10 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"> ",2);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_f0,lVar7);
  std::endl<char,std::char_traits<char>>(poVar10);
  system(local_f0);
LAB_00104916:
  exit(0);
}

Assistant:

void select() {
    int key;
    while (true) {
        key = getKey();
        if (key == '\n' || key == '\r') {
            const auto &x = hosts[currentIndex];
            std::string cmd = "ssh " + x.userName + "@" + x.address + " -p" + std::to_string(x.port);
            std::cout << std::endl << "> " << cmd << std::endl;
            system(cmd.c_str());
            exit(0);
        } else if (key == config.upKey) {
            currentIndex = (currentIndex - 1) % int(hosts.size());
        } else if (key == config.downKey) {
            currentIndex = (currentIndex + 1) % int(hosts.size());
        } else {
            exit(0);
        }
        currentIndex = (currentIndex + int(hosts.size())) % int(hosts.size());
        display();
    }
}